

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

void __thiscall smf::MidiEventList::removeEmpties(MidiEventList *this)

{
  MidiEvent *this_00;
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference ppMVar4;
  int local_40;
  int i_1;
  undefined1 local_30 [8];
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> newlist;
  int i;
  int count;
  MidiEventList *this_local;
  
  newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      iVar1 = (int)newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
      sVar3 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(&this->list),
      iVar1 < (int)sVar3;
      newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    ppMVar4 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                        (&this->list,
                         (long)(int)newlist.
                                    super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)*ppMVar4);
    if (bVar2) {
      ppMVar4 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                          (&this->list,
                           (long)(int)newlist.
                                      super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = *ppMVar4;
      if (this_00 != (MidiEvent *)0x0) {
        MidiEvent::~MidiEvent(this_00);
        operator_delete(this_00);
      }
      ppMVar4 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                          (&this->list,
                           (long)(int)newlist.
                                      super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *ppMVar4 = (value_type)0x0;
      newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
  }
  if (newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::vector
              ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)local_30);
    sVar3 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(&this->list);
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve
              ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)local_30,
               sVar3 - (long)newlist.
                             super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    for (local_40 = 0;
        sVar3 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(&this->list),
        local_40 < (int)sVar3; local_40 = local_40 + 1) {
      ppMVar4 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                          (&this->list,(long)local_40);
      if (*ppMVar4 != (value_type)0x0) {
        ppMVar4 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                            (&this->list,(long)local_40);
        std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back
                  ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)local_30,ppMVar4);
      }
    }
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::swap
              (&this->list,(vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)local_30);
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::~vector
              ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)local_30);
  }
  return;
}

Assistant:

void MidiEventList::removeEmpties(void) {
	int count = 0;
	for (int i=0; i<(int)list.size(); i++) {
		if (list[i]->empty()) {
			delete list[i];
			list[i] = NULL;
			count++;
		}
	}
	if (count == 0) {
		return;
	}
	std::vector<MidiEvent*> newlist;
	newlist.reserve(list.size() - count);
	for (int i=0; i<(int)list.size(); i++) {
		if (list[i]) {
			newlist.push_back(list[i]);
		}
	}
	list.swap(newlist);
}